

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O2

void dumpStringOffsetsSection
               (raw_ostream *OS,StringRef SectionName,DWARFObject *Obj,
               DWARFSection *StringOffsetsSection,StringRef StringSection,unit_iterator_range Units,
               bool LittleEndian,uint MaxVersion)

{
  DwarfFormat DVar1;
  uint16_t uVar2;
  DWARFUnit *pDVar3;
  DWARFSection *pDVar4;
  uint64_t uVar5;
  long lVar6;
  uint64_t uVar7;
  undefined7 uVar8;
  pointer pOVar9;
  bool bVar10;
  byte bVar11;
  uint32_t uVar12;
  ulong uVar13;
  StrOffsetsContributionDescriptor *pSVar14;
  raw_ostream *prVar15;
  __normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_*,_std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>_>
  _Var16;
  Optional<llvm::StrOffsetsContributionDescriptor> *extraout_RDX;
  Optional<llvm::StrOffsetsContributionDescriptor> *extraout_RDX_00;
  Optional<llvm::StrOffsetsContributionDescriptor> *extraout_RDX_01;
  Optional<llvm::StrOffsetsContributionDescriptor> *extraout_RDX_02;
  Optional<llvm::StrOffsetsContributionDescriptor> *extraout_RDX_03;
  Optional<llvm::StrOffsetsContributionDescriptor> *extraout_RDX_04;
  char *pcVar17;
  undefined3 in_register_00000089;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1;
  long lVar18;
  OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true> *pOVar19;
  __normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_*,_std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>_>
  __it1;
  undefined1 auVar21 [8];
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__end1;
  _func_int **pp_Var22;
  const_iterator __first;
  DWARFSection *pDVar23;
  undefined1 local_f0 [8];
  DWARFDataExtractor StrOffsetExt;
  uint64_t StringOffset;
  undefined1 local_b0 [8];
  DataExtractor StrData;
  undefined1 auStack_78 [8];
  ContributionCollection Contributions;
  _func_int **local_58;
  uint64_t offset;
  DWARFSection *local_48;
  _func_int **local_40;
  DWARFSection *local_38;
  uint64_t Offset;
  Optional<llvm::StrOffsetsContributionDescriptor> *pOVar20;
  
  _Var16._M_current = (Optional<llvm::StrOffsetsContributionDescriptor> *)SectionName.Length;
  if (MaxVersion < 5) {
    local_f0 = (undefined1  [8])(StringOffsetsSection->Data).Data;
    pp_Var22 = (_func_int **)(StringOffsetsSection->Data).Length;
    StrOffsetExt.super_DataExtractor.Data.Length._1_1_ = 0;
    local_58 = (_func_int **)0x0;
    StrOffsetExt.super_DataExtractor.Data.Data = (char *)pp_Var22;
    StrOffsetExt.super_DataExtractor.Data.Length._0_1_ = LittleEndian;
    if (((ulong)pp_Var22 & 3) != 0) {
      prVar15 = llvm::raw_ostream::operator<<(OS,"error: size of .");
      prVar15 = llvm::raw_ostream::operator<<(prVar15,SectionName);
      prVar15 = llvm::raw_ostream::operator<<(prVar15," is not a multiple of ");
      prVar15 = llvm::raw_ostream::operator<<(prVar15,4);
      llvm::raw_ostream::operator<<(prVar15,".\n");
      pp_Var22 = (_func_int **)((ulong)pp_Var22 & 0xfffffffffffffffc);
    }
    auStack_78 = (undefined1  [8])StringSection.Data;
    Contributions.
    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)StringSection.Length;
    Contributions.
    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_2_ = CONCAT11(0,LittleEndian);
    StrData.Data.Length = (size_t)(_func_int **)0x0;
    while (StrData.Data.Length < pp_Var22) {
      StrData.Data.Data = "0x%8.8lx: ";
      local_b0 = (undefined1  [8])&PTR_home_00e22798;
      llvm::raw_ostream::operator<<(OS,(format_object_base *)local_b0);
      uVar12 = llvm::DataExtractor::getU32
                         ((DataExtractor *)local_f0,(uint64_t *)&stack0xffffffffffffffa8,
                          (Error *)0x0);
      StrData.Data.Length = (size_t)uVar12;
      StrData.Data.Data = "%8.8lx  ";
      local_b0 = (undefined1  [8])&PTR_home_00e22798;
      local_38 = (DWARFSection *)StrData.Data.Length;
      llvm::raw_ostream::operator<<(OS,(format_object_base *)local_b0);
      pcVar17 = llvm::DataExtractor::getCStr((DataExtractor *)auStack_78,(uint64_t *)&local_38);
      if (pcVar17 != (char *)0x0) {
        StrData.Data.Data = "\"%s\"";
        local_b0 = (undefined1  [8])&PTR_home_00e22ac8;
        StrData.Data.Length = (size_t)pcVar17;
        llvm::raw_ostream::operator<<(OS,(format_object_base *)local_b0);
      }
      llvm::raw_ostream::operator<<(OS,"\n");
      StrData.Data.Length = (size_t)local_58;
    }
  }
  else {
    local_40 = (_func_int **)CONCAT44(local_40._4_4_,CONCAT31(in_register_00000089,LittleEndian));
    auStack_78 = (undefined1  [8])0x0;
    Contributions.
    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Contributions.
    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    StrData._16_8_ = Obj;
    for (; pOVar9 = Contributions.
                    super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, auVar21 = auStack_78,
        Units.begin_iterator != Units.end_iterator; Units.begin_iterator = Units.begin_iterator + 1)
    {
      pDVar3 = ((Units.begin_iterator)->_M_t).
               super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
               super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
               super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
      if (*(bool *)((long)&(pDVar3->StringOffsetsTableContribution).Storage + 0x18) == true) {
        std::
        vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
        ::push_back((vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                     *)auStack_78,&pDVar3->StringOffsetsTableContribution);
        _Var16._M_current = extraout_RDX;
      }
    }
    if (auStack_78 !=
        (undefined1  [8])
        Contributions.
        super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar18 = (long)Contributions.
                     super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78;
      uVar13 = lVar18 >> 5;
      lVar6 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>*,std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::__0>>
                (auStack_78,
                 Contributions.
                 super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar18 < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>*,std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>>,__gnu_cxx::__ops::_Iter_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::__0>>
                  (auVar21,pOVar9);
        _Var16._M_current = extraout_RDX_02;
      }
      else {
        pOVar19 = (OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true> *)
                  ((long)auVar21 + 0x200);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>*,std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>>,__gnu_cxx::__ops::_Iter_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::__0>>
                  (auVar21,pOVar19);
        _Var16._M_current = extraout_RDX_00;
        for (; pOVar19 != &pOVar9->Storage; pOVar19 = pOVar19 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>*,std::vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>>>>,__gnu_cxx::__ops::_Val_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::__0>>
                    (pOVar19);
          _Var16._M_current = extraout_RDX_01;
        }
      }
    }
    __first._M_current =
         Contributions.
         super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __it1._M_current = (Optional<llvm::StrOffsetsContributionDescriptor> *)auStack_78;
    if (auStack_78 !=
        (undefined1  [8])
        Contributions.
        super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        pOVar19 = &(__it1._M_current)->Storage;
        __it1._M_current = (Optional<llvm::StrOffsetsContributionDescriptor> *)(pOVar19 + 1);
        if (__it1._M_current == __first._M_current) goto LAB_00b23e6a;
        bVar10 = __gnu_cxx::__ops::
                 _Iter_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::$_1>
                 ::operator()(pOVar19,__it1,_Var16);
        _Var16._M_current = extraout_RDX_03;
      } while (!bVar10);
      while (pOVar20 = __it1._M_current, __it1._M_current = pOVar20 + 1,
            __it1._M_current != __first._M_current) {
        bVar10 = __gnu_cxx::__ops::
                 _Iter_comp_iter<collectContributionData(llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>)::$_1>
                 ::operator()(pOVar19,__it1,_Var16);
        _Var16._M_current = extraout_RDX_04;
        if (!bVar10) {
          uVar5 = ((__it1._M_current)->Storage).field_0.value.Base;
          uVar7 = pOVar20[1].Storage.field_0.value.Size;
          bVar10 = pOVar20[1].Storage.hasVal;
          uVar8 = *(undefined7 *)&pOVar20[1].Storage.field_0x19;
          *(undefined8 *)((long)&pOVar19[1].field_0 + 0x10) =
               *(undefined8 *)((long)&pOVar20[1].Storage.field_0 + 0x10);
          pOVar19[1].hasVal = bVar10;
          *(undefined7 *)&pOVar19[1].field_0x19 = uVar8;
          (((anon_union_24_2_fc7899a5_for_OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true>_2
             *)&pOVar19[1].field_0.value.Base)->value).Base = uVar5;
          pOVar19[1].field_0.value.Size = uVar7;
          pOVar19 = pOVar19 + 1;
        }
      }
      __first._M_current = (Optional<llvm::StrOffsetsContributionDescriptor> *)(pOVar19 + 1);
    }
LAB_00b23e6a:
    std::
    vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ::erase((vector<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
             *)auStack_78,__first,
            (const_iterator)
            Contributions.
            super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
            ._M_impl.super__Vector_impl_data._M_start);
    pOVar9 = Contributions.
             super__Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f0 = (undefined1  [8])(StringOffsetsSection->Data).Data;
    pDVar4 = (DWARFSection *)(StringOffsetsSection->Data).Length;
    StrOffsetExt.super_DataExtractor.Data.Length._0_1_ = (byte)local_40;
    StrOffsetExt.super_DataExtractor.Data.Length._1_1_ = 0;
    StrOffsetExt.super_DataExtractor.IsLittleEndian = StrData.IsLittleEndian;
    StrOffsetExt.super_DataExtractor.AddressSize = StrData.AddressSize;
    StrOffsetExt.super_DataExtractor._18_6_ = StrData._18_6_;
    local_b0 = (undefined1  [8])StringSection.Data;
    StrData.Data.Data = (char *)StringSection.Length;
    local_38 = (DWARFSection *)0x0;
    StrData.Data.Length._0_2_ = CONCAT11(0,(byte)StrOffsetExt.super_DataExtractor.Data.Length);
    local_40 = (_func_int **)&PTR_home_00e22798;
    StrData._16_8_ = &PTR_home_00e22ac8;
    StrOffsetExt.super_DataExtractor.Data.Data = (char *)pDVar4;
    StrOffsetExt.Obj = (DWARFObject *)StringOffsetsSection;
    for (auVar21 = auStack_78; auVar21 != (undefined1  [8])pOVar9;
        auVar21 = (undefined1  [8])((long)auVar21 + 0x20)) {
      if (((OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true> *)auVar21)->hasVal ==
          false) {
        prVar15 = llvm::raw_ostream::operator<<
                            (OS,"error: invalid contribution to string offsets table in section .");
        prVar15 = llvm::raw_ostream::operator<<(prVar15,SectionName);
        llvm::raw_ostream::operator<<(prVar15,".\n");
        goto LAB_00b24233;
      }
      pSVar14 = llvm::optional_detail::OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true>
                ::getValue((OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true> *)auVar21)
      ;
      DVar1 = (pSVar14->FormParams).Format;
      pSVar14 = llvm::optional_detail::OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true>
                ::getValue((OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true> *)auVar21)
      ;
      uVar2 = (pSVar14->FormParams).Version;
      pSVar14 = llvm::optional_detail::OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true>
                ::getValue((OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true> *)auVar21)
      ;
      uVar13 = (ulong)(DVar1 == DWARF32) << 3 | 0xfffffffffffffff0;
      bVar11 = (byte)uVar2;
      if (bVar11 < 5) {
        uVar13 = 0;
      }
      pDVar23 = (DWARFSection *)(uVar13 + pSVar14->Base);
      if (pDVar23 < local_38) {
        prVar15 = llvm::WithColor::error();
        prVar15 = llvm::raw_ostream::operator<<
                            (prVar15,
                             "overlapping contributions to string offsets table in section .");
        prVar15 = llvm::raw_ostream::operator<<(prVar15,SectionName);
        llvm::raw_ostream::operator<<(prVar15,".\n");
        goto LAB_00b24233;
      }
      if (local_38 < pDVar23) {
        offset = (uint64_t)anon_var_dwarf_2cd5626;
        local_58 = local_40;
        local_48 = local_38;
        llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffffa8);
        prVar15 = llvm::raw_ostream::operator<<(OS,(long)pDVar23 - (long)local_38);
        llvm::raw_ostream::operator<<(prVar15,"\n");
      }
      offset = (long)"\n0x%8.8lx: " + 1;
      local_58 = local_40;
      local_48 = pDVar23;
      llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffffa8);
      prVar15 = llvm::raw_ostream::operator<<(OS,"Contribution size = ");
      pSVar14 = llvm::optional_detail::OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true>
                ::getValue((OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true> *)auVar21)
      ;
      prVar15 = llvm::raw_ostream::operator<<(prVar15,(ulong)(4 < bVar11) * 4 + pSVar14->Size);
      prVar15 = llvm::raw_ostream::operator<<(prVar15,", Format = ");
      pcVar17 = "DWARF64";
      if (DVar1 == DWARF32) {
        pcVar17 = "DWARF32";
      }
      prVar15 = llvm::raw_ostream::operator<<(prVar15,pcVar17);
      prVar15 = llvm::raw_ostream::operator<<(prVar15,", Version = ");
      prVar15 = llvm::raw_ostream::operator<<(prVar15,(uint)bVar11);
      llvm::raw_ostream::operator<<(prVar15,"\n");
      pSVar14 = llvm::optional_detail::OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true>
                ::getValue((OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true> *)auVar21)
      ;
      local_38 = (DWARFSection *)pSVar14->Base;
      pSVar14 = llvm::optional_detail::OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true>
                ::getValue((OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true> *)auVar21)
      ;
      bVar11 = llvm::dwarf::FormParams::getDwarfOffsetByteSize(&pSVar14->FormParams);
      while( true ) {
        pDVar23 = local_38;
        pSVar14 = llvm::optional_detail::
                  OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true>::getValue
                            ((OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true> *)
                             auVar21);
        uVar5 = pSVar14->Base;
        pSVar14 = llvm::optional_detail::
                  OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true>::getValue
                            ((OptionalStorage<llvm::StrOffsetsContributionDescriptor,_true> *)
                             auVar21);
        if (pSVar14->Size <= (long)pDVar23 - uVar5) break;
        offset = (long)"\n0x%8.8lx: " + 1;
        local_58 = local_40;
        local_48 = local_38;
        llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffffa8);
        StrOffsetExt.Section =
             (DWARFSection *)
             llvm::DWARFDataExtractor::getRelocatedValue
                       ((DWARFDataExtractor *)local_f0,(uint)bVar11,(uint64_t *)&local_38,
                        (uint64_t *)0x0,(Error *)0x0);
        offset = (long)"0x%8.8lx " + 2;
        local_58 = local_40;
        local_48 = StrOffsetExt.Section;
        llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffffa8);
        pDVar23 = (DWARFSection *)
                  llvm::DataExtractor::getCStr
                            ((DataExtractor *)local_b0,(uint64_t *)&StrOffsetExt.Section);
        if (pDVar23 != (DWARFSection *)0x0) {
          offset = (uint64_t)anon_var_dwarf_2cd55f0;
          local_58 = (_func_int **)StrData._16_8_;
          local_48 = pDVar23;
          llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffffa8);
        }
        llvm::raw_ostream::operator<<(OS,"\n");
      }
    }
    if (local_38 < pDVar4) {
      offset = (uint64_t)anon_var_dwarf_2cd5626;
      local_58 = local_40;
      local_48 = local_38;
      llvm::raw_ostream::operator<<(OS,(format_object_base *)&stack0xffffffffffffffa8);
      prVar15 = llvm::raw_ostream::operator<<(OS,(long)pDVar4 - (long)local_38);
      llvm::raw_ostream::operator<<(prVar15,"\n");
    }
LAB_00b24233:
    std::
    _Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
    ::~_Vector_base((_Vector_base<llvm::Optional<llvm::StrOffsetsContributionDescriptor>,_std::allocator<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>_>
                     *)auStack_78);
  }
  return;
}

Assistant:

static void dumpStringOffsetsSection(raw_ostream &OS, StringRef SectionName,
                                     const DWARFObject &Obj,
                                     const DWARFSection &StringOffsetsSection,
                                     StringRef StringSection,
                                     DWARFContext::unit_iterator_range Units,
                                     bool LittleEndian, unsigned MaxVersion) {
  // If we have at least one (compile or type) unit with DWARF v5 or greater,
  // we assume that the section is formatted like a DWARF v5 string offsets
  // section.
  if (MaxVersion >= 5)
    dumpDWARFv5StringOffsetsSection(OS, SectionName, Obj, StringOffsetsSection,
                                    StringSection, Units, LittleEndian);
  else {
    DataExtractor strOffsetExt(StringOffsetsSection.Data, LittleEndian, 0);
    uint64_t offset = 0;
    uint64_t size = StringOffsetsSection.Data.size();
    // Ensure that size is a multiple of the size of an entry.
    if (size & ((uint64_t)(sizeof(uint32_t) - 1))) {
      OS << "error: size of ." << SectionName << " is not a multiple of "
         << sizeof(uint32_t) << ".\n";
      size &= -(uint64_t)sizeof(uint32_t);
    }
    DataExtractor StrData(StringSection, LittleEndian, 0);
    while (offset < size) {
      OS << format("0x%8.8" PRIx64 ": ", offset);
      uint64_t StringOffset = strOffsetExt.getU32(&offset);
      OS << format("%8.8" PRIx64 "  ", StringOffset);
      const char *S = StrData.getCStr(&StringOffset);
      if (S)
        OS << format("\"%s\"", S);
      OS << "\n";
    }
  }
}